

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one.hpp
# Opt level: O0

bool tao::pegtl::internal::
     one<(tao::pegtl::internal::result_on_found)1,tao::pegtl::internal::peek_char,(char)34,(char)92,(char)98,(char)102,(char)110,(char)114,(char)116>
     ::
     match<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in)

{
  bool bVar1;
  pair_t t;
  string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd1;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffffd3;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffffd4;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffd5;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 uVar8;
  pair_t local_12 [9];
  
  bVar1 = memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty((memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffffd7,
                              CONCAT16(in_stack_ffffffffffffffd6,
                                       CONCAT15(in_stack_ffffffffffffffd5,
                                                CONCAT14(in_stack_ffffffffffffffd4,
                                                         CONCAT13(in_stack_ffffffffffffffd3,
                                                                  CONCAT12(in_stack_ffffffffffffffd2
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffffd1,
                                                  in_stack_ffffffffffffffd0))))))));
  if (!bVar1) {
    local_12[0] = peek_char::
                  peek<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
                            (in_stack_ffffffffffffffc8,0x1cefbd);
    bVar1 = input_pair::operator_cast_to_bool((input_pair *)local_12);
    if (bVar1) {
      uVar2 = 0x22;
      uVar3 = 0x5c;
      uVar4 = 0x62;
      uVar5 = 0x66;
      uVar6 = 0x6e;
      uVar7 = 0x72;
      uVar8 = 0x74;
      bVar1 = contains<char>('\0',(initializer_list<char> *)&stack0xffffffffffffffd1);
      if (bVar1) {
        bump_help<(tao::pegtl::internal::result_on_found)1,_tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,____,_____,__b_,__f_,__n_,__r_,__t_>
                  ((string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(uVar4,
                                                  CONCAT12(uVar3,CONCAT11(uVar2,
                                                  in_stack_ffffffffffffffd0))))))),
                   (size_t)in_stack_ffffffffffffffc8);
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool match( Input& in ) noexcept( noexcept( in.empty() ) )
            {
               if( !in.empty() ) {
                  if( const auto t = Peek::peek( in ) ) {
                     if( contains( t.data, { Cs... } ) == bool( R ) ) {
                        bump_help< R, Input, typename Peek::data_t, Cs... >( in, t.size );
                        return true;
                     }
                  }
               }
               return false;
            }